

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  void *flagvalue;
  undefined8 uVar3;
  void *pvVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int jx;
  long lVar16;
  int flag;
  uint local_110;
  undefined4 local_10c;
  void *kmem;
  uint local_fc;
  SUNContext sunctx;
  void *local_f0;
  long *local_e8;
  void *local_e0;
  long *local_d8;
  ulong local_d0;
  long local_c8;
  long nfeSG;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long nfe;
  long alStack_80 [3];
  sunrealtype ctemp [6];
  
  sunctx = (SUNContext)0x0;
  SUNContext_Create(0);
  kmem = (void *)0x0;
  flagvalue = malloc(0x1f8);
  lVar15 = (long)flagvalue + 200;
  local_c8 = lVar15;
  for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
    for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
      uVar3 = SUNDlsMat_newDenseMat(6,6);
      *(undefined8 *)(lVar15 + -200 + lVar7 * 8) = uVar3;
      uVar3 = SUNDlsMat_newIndexArray(6);
      *(undefined8 *)(lVar15 + lVar7 * 8) = uVar3;
    }
    lVar15 = lVar15 + 0x28;
  }
  uVar3 = SUNDlsMat_newDenseMat(6,6);
  *(undefined8 *)((long)flagvalue + 400) = uVar3;
  pvVar4 = malloc(0x30);
  *(void **)((long)flagvalue + 0x198) = pvVar4;
  pvVar4 = malloc(0x30);
  *(void **)((long)flagvalue + 0x1a8) = pvVar4;
  pvVar4 = malloc(0x30);
  *(void **)((long)flagvalue + 0x1b0) = pvVar4;
  iVar1 = check_flag(flagvalue,"AllocUserData",2);
  iVar2 = 1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)flagvalue + 0x1e8) = 0x500000005;
    *(undefined8 *)((long)flagvalue + 0x1f0) = 0x300000006;
    *(undefined8 *)((long)flagvalue + 0x1b8) = 0x3ff0000000000000;
    *(undefined8 *)((long)flagvalue + 0x1c0) = 0x3ff0000000000000;
    *(undefined8 *)((long)flagvalue + 0x1c8) = 0x3fd0000000000000;
    *(undefined8 *)((long)flagvalue + 0x1d0) = 0x3fd0000000000000;
    *(undefined4 *)((long)flagvalue + 0x1d8) = 0;
    *(undefined4 *)((long)flagvalue + 0x1dc) = 0x3cb00000;
    *(undefined4 *)((long)flagvalue + 0x1e0) = 0;
    *(undefined4 *)((long)flagvalue + 0x1e4) = 0x3e500000;
    lVar14 = *(long *)((long)flagvalue + 400);
    lVar15 = *(long *)((long)flagvalue + 0x198);
    lVar7 = *(long *)((long)flagvalue + 0x1a8);
    lVar8 = *(long *)((long)flagvalue + 0x1b0);
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      lVar11 = *(long *)(lVar14 + lVar10 * 8);
      lVar12 = *(long *)(lVar14 + 0x18 + lVar10 * 8);
      for (lVar16 = 0; (int)lVar16 != 3; lVar16 = lVar16 + 1) {
        *(undefined8 *)(lVar11 + 0x18 + lVar16 * 8) = 0xbea0c6f7a0b5ed8d;
        *(undefined8 *)(lVar12 + lVar16 * 8) = 0x40c3880000000000;
        *(undefined8 *)(lVar11 + lVar16 * 8) = 0;
        *(undefined8 *)(lVar12 + 0x18 + lVar16 * 8) = 0;
      }
      *(undefined8 *)(lVar11 + lVar10 * 8) = 0xbff0000000000000;
      *(undefined8 *)(lVar12 + 0x18 + lVar10 * 8) = 0xbff0000000000000;
      *(undefined8 *)(lVar15 + lVar10 * 8) = 0x3ff0000000000000;
      *(undefined8 *)(lVar15 + 0x18 + lVar10 * 8) = 0xbff0000000000000;
      *(undefined8 *)(lVar7 + lVar10 * 8) = 0x4030000000000000;
      *(undefined8 *)(lVar7 + 0x18 + lVar10 * 8) = 0x4020000000000000;
      *(undefined8 *)(lVar8 + lVar10 * 8) = 0x4030000000000000;
      *(undefined8 *)(lVar8 + 0x18 + lVar10 * 8) = 0x4020000000000000;
    }
    plVar5 = (long *)N_VNew_Serial(0x96,sunctx);
    iVar2 = check_flag(plVar5,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      plVar6 = (long *)N_VNew_Serial(0x96,sunctx);
      iVar1 = check_flag(plVar6,"N_VNew_Serial",0);
      iVar2 = 1;
      if (iVar1 == 0) {
        pvVar4 = (void *)N_VNew_Serial(0x96,sunctx);
        *(void **)((long)flagvalue + 0x1a0) = pvVar4;
        iVar1 = check_flag(pvVar4,"N_VNew_Serial",0);
        if (iVar1 == 0) {
          pvVar4 = (void *)N_VNew_Serial(0x96,sunctx);
          iVar1 = check_flag(pvVar4,"N_VNew_Serial",0);
          if (iVar1 == 0) {
            local_e0 = pvVar4;
            N_VConst(0,pvVar4);
            local_f0 = (void *)0x0;
            local_e8 = plVar6;
            local_d8 = plVar5;
            for (uVar13 = 0; plVar6 = local_d8, plVar5 = local_e8, uVar13 != 4; uVar13 = uVar13 + 1)
            {
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                ctemp[lVar14] = 1.0;
                (&nfe)[lVar14] = 0x3ff0000000000000;
              }
              for (lVar14 = 3; lVar14 != 6; lVar14 = lVar14 + 1) {
                ctemp[lVar14] = 30000.0;
                (&nfe)[lVar14] = 0x3ee4f8b588e368f1;
              }
              lVar14 = *(long *)(*local_d8 + 0x10);
              lVar15 = *(long *)(*local_e8 + 0x10);
              for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
                lVar8 = lVar14;
                lVar10 = lVar15;
                for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
                  for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                    *(sunrealtype *)(lVar8 + lVar12 * 8) = ctemp[lVar12];
                    *(long *)(lVar10 + lVar12 * 8) = (&nfe)[lVar12];
                  }
                  lVar10 = lVar10 + 0x30;
                  lVar8 = lVar8 + 0x30;
                }
                lVar15 = lVar15 + 0xf0;
                lVar14 = lVar14 + 0xf0;
              }
              kmem = (void *)KINCreate(sunctx);
              iVar2 = check_flag(kmem,"KINCreate",0);
              if (iVar2 != 0) {
                return 1;
              }
              local_fc = uVar13;
              flag = KINInit(kmem,func,plVar6);
              iVar2 = check_flag(&flag,"KINInit",1);
              if (iVar2 != 0) {
                return 1;
              }
              flag = KINSetUserData(kmem,flagvalue);
              iVar2 = check_flag(&flag,"KINSetUserData",1);
              if (iVar2 != 0) {
                return 1;
              }
              flag = KINSetConstraints(kmem,local_e0);
              iVar2 = check_flag(&flag,"KINSetConstraints",1);
              if (iVar2 != 0) {
                return 1;
              }
              flag = KINSetFuncNormTol(0x9abcaf48,kmem);
              iVar2 = check_flag(&flag,"KINSetFuncNormTol",1);
              if (iVar2 != 0) {
                return 1;
              }
              flag = KINSetScaledStepTol(0x68497682,kmem);
              iVar2 = check_flag(&flag,"KINSetScaledStepTol",1);
              if (iVar2 != 0) {
                return 1;
              }
              local_d0 = (ulong)local_fc;
              switch(local_d0) {
              case 0:
                printf(" -------");
                puts(" \n| SPGMR |");
                puts(" -------");
                pvVar4 = (void *)SUNLinSol_SPGMR(plVar6,2,0xf,sunctx);
                pcVar9 = "SUNLinSol_SPGMR";
                break;
              case 1:
                printf(" --------");
                puts(" \n| SPBCGS |");
                puts(" --------");
                pvVar4 = (void *)SUNLinSol_SPBCGS(plVar6,2,0xf,sunctx);
                iVar2 = check_flag(pvVar4,"SUNLinSol_SPBCGS",0);
                if (iVar2 != 0) {
                  return 1;
                }
                local_f0 = pvVar4;
                flag = KINSetLinearSolver(kmem,pvVar4,0);
                iVar2 = check_flag(&flag,"KINSetLinearSolver",1);
                local_110 = 0xf;
                goto LAB_00102ab1;
              case 2:
                printf(" ---------");
                puts(" \n| SPTFQMR |");
                puts(" ---------");
                pvVar4 = (void *)SUNLinSol_SPTFQMR(plVar6,2,0x19,sunctx);
                iVar2 = check_flag(pvVar4,"SUNLinSol_SPTFQMR",0);
                if (iVar2 != 0) {
                  return 1;
                }
                local_f0 = pvVar4;
                flag = KINSetLinearSolver(kmem,pvVar4,0);
                iVar2 = check_flag(&flag,"KINSetLinearSolver",1);
                local_110 = 0x19;
LAB_00102ab1:
                if (iVar2 != 0) {
                  return 1;
                }
                goto switchD_0010288f_default;
              case 3:
                printf(" -------");
                puts(" \n| SPFGMR |");
                puts(" -------");
                pvVar4 = (void *)SUNLinSol_SPFGMR(plVar6,2,0xf,sunctx);
                pcVar9 = "SUNLinSol_SPFGMR";
                break;
              default:
                goto switchD_0010288f_default;
              }
              iVar2 = check_flag(pvVar4,pcVar9,0);
              if (iVar2 != 0) {
                return 1;
              }
              flag = KINSetLinearSolver(kmem,pvVar4,0);
              iVar2 = check_flag(&flag,"KINSetLinearSolver",1);
              if (iVar2 != 0) {
                return 1;
              }
              local_f0 = pvVar4;
              flag = SUNLinSol_SPGMRSetMaxRestarts(pvVar4,2);
              iVar2 = check_flag(&flag,"SUNLinSol_SPGMRSetMaxRestarts",1);
              local_110 = 0xf;
              plVar5 = local_e8;
              if (iVar2 != 0) {
                return 1;
              }
switchD_0010288f_default:
              uVar13 = local_fc;
              flag = KINSetPreconditioner(kmem,PrecSetupBD,PrecSolveBD);
              iVar2 = check_flag(&flag,"KINSetPreconditioner",1);
              if (iVar2 != 0) {
                return 1;
              }
              puts("\nPredator-prey test problem --  KINSol (serial version)\n");
              printf("Mesh dimensions = %d X %d\n",5);
              printf("Number of species = %d\n",6);
              printf("Total system size = %d\n\n",0x96);
              printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n",0);
              if (3 < uVar13) goto LAB_00102ba4;
              switch((long)&switchD_00102b67::switchdataD_001040a8 +
                     (long)(int)(&switchD_00102b67::switchdataD_001040a8)[local_d0]) {
              case 0x102b69:
                pcVar9 = "Linear solver is SPGMR with maxl = %d, maxlrst = %d\n";
                break;
              case 0x102b72:
                pcVar9 = "Linear solver is SPTFQMR with maxl = %d\n";
LAB_00102b99:
                printf(pcVar9,(ulong)local_110);
                goto LAB_00102ba4;
              case 0x102b7b:
                pcVar9 = "Linear solver is SPFGMR with maxl = %d, maxlrst = %d\n";
                break;
              case 0x102b92:
                pcVar9 = "Linear solver is SPBCGS with maxl = %d\n";
                goto LAB_00102b99;
              }
              printf(pcVar9,(ulong)local_110,2);
LAB_00102ba4:
              puts("Preconditioning uses interaction-only block-diagonal matrix");
              puts("Positivity constraints imposed on all components ");
              printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",0x9abcaf48,
                     0x3d3c25c268497682);
              puts("\nInitial profile of concentration");
              printf("At all mesh points:  %g %g %g   %g %g %g\n",0,0x3ff0000000000000,0,
                     0x40dd4c0000000000,0,0);
              flag = KINSol(kmem,plVar6,0,plVar5);
              iVar2 = check_flag(&flag,"KINSol",1);
              if (iVar2 != 0) {
                return 1;
              }
              puts("\n\nComputed equilibrium species concentrations:");
              lVar14 = *(long *)(*plVar6 + 0x10);
              printf("\nAt bottom left:");
              lVar7 = 0;
              for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
                if (lVar7 == lVar15) {
                  putchar(10);
                }
                printf(" %g",(int)*(undefined8 *)(lVar14 + lVar15 * 8));
                lVar7 = lVar7 + 6;
              }
              lVar14 = *(long *)(*local_d8 + 0x10);
              printf("\n\nAt top right:");
              lVar7 = 0;
              for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
                if (lVar7 == lVar15) {
                  putchar(10);
                }
                printf(" %g",(int)*(undefined8 *)(lVar14 + 0x480 + lVar15 * 8));
                lVar7 = lVar7 + 6;
              }
              puts("\n");
              pvVar4 = kmem;
              local_10c = KINGetNumNonlinSolvIters(kmem,ctemp);
              check_flag(&local_10c,"KINGetNumNonlinSolvIters",1);
              local_10c = KINGetNumFuncEvals(pvVar4,&nfe);
              check_flag(&local_10c,"KINGetNumFuncEvals",1);
              local_10c = KINGetNumLinIters(pvVar4,&nli);
              check_flag(&local_10c,"KINGetNumLinIters",1);
              local_10c = KINGetNumPrecEvals(pvVar4,&npe);
              check_flag(&local_10c,"KINGetNumPrecEvals",1);
              local_10c = KINGetNumPrecSolves(pvVar4,&nps);
              check_flag(&local_10c,"KINGetNumPrecSolves",1);
              local_10c = KINGetNumLinConvFails(pvVar4,&ncfl);
              check_flag(&local_10c,"KINGetNumLinConvFails",1);
              local_10c = KINGetNumLinFuncEvals(pvVar4,&nfeSG);
              check_flag(&local_10c,"KINGetNumLinFuncEvals",1);
              puts("Final Statistics.. ");
              printf("nni    = %5ld    nli   = %5ld\n",ctemp[0],nli);
              printf("nfe    = %5ld    nfeSG = %5ld\n",nfe,nfeSG);
              printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n",nps,npe,ncfl);
              uVar13 = local_fc;
              if (local_fc != 3) {
                puts("\n=========================================================\n");
              }
              KINFree(&kmem);
              SUNLinSolFree(local_f0);
            }
            N_VDestroy(local_e0);
            N_VDestroy(plVar6);
            N_VDestroy(plVar5);
            lVar14 = local_c8;
            for (lVar15 = 0; lVar15 != 5; lVar15 = lVar15 + 1) {
              for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
                SUNDlsMat_destroyMat(*(undefined8 *)(lVar14 + -200 + lVar7 * 8));
                SUNDlsMat_destroyArray(*(undefined8 *)(lVar14 + lVar7 * 8));
              }
              lVar14 = lVar14 + 0x28;
            }
            SUNDlsMat_destroyMat(*(undefined8 *)((long)flagvalue + 400));
            free(*(void **)((long)flagvalue + 0x198));
            free(*(void **)((long)flagvalue + 0x1a8));
            free(*(void **)((long)flagvalue + 0x1b0));
            N_VDestroy(*(undefined8 *)((long)flagvalue + 0x1a0));
            free(flagvalue);
            SUNContext_Free(&sunctx);
            iVar2 = 0;
          }
        }
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
  int globalstrategy, linsolver;
  sunrealtype fnormtol, scsteptol;
  N_Vector cc, sc, constraints;
  UserData data;
  int flag, maxl, maxlrst;
  void* kmem;
  SUNLinearSolver LS;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext sunctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &sunctx);

  cc = sc = constraints = NULL;
  kmem                  = NULL;
  LS                    = NULL;
  data                  = NULL;

  /* Allocate memory, and set problem data, initial values, tolerances */
  globalstrategy = KIN_NONE;

  data = AllocUserData();
  if (check_flag((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create serial vectors of length NEQ */
  cc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)cc, "N_VNew_Serial", 0)) { return (1); }
  sc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)sc, "N_VNew_Serial", 0)) { return (1); }
  data->rates = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)data->rates, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(TWO, constraints);

  fnormtol  = FTOL;
  scsteptol = STOL;

  /* START: Loop through SPGMR, SPBCGS, SPTFQMR and SPFGMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    /* (Re-)Initialize user data */
    SetInitialProfiles(cc, sc);

    /* Call KINCreate/KINInit to initialize KINSOL:
       A pointer to KINSOL problem memory is returned and stored in kmem. */
    kmem = KINCreate(sunctx);
    if (check_flag((void*)kmem, "KINCreate", 0)) { return (1); }

    /* Vector cc passed as template vector. */
    flag = KINInit(kmem, func, cc);
    if (check_flag(&flag, "KINInit", 1)) { return (1); }

    flag = KINSetUserData(kmem, data);
    if (check_flag(&flag, "KINSetUserData", 1)) { return (1); }
    flag = KINSetConstraints(kmem, constraints);
    if (check_flag(&flag, "KINSetConstraints", 1)) { return (1); }
    flag = KINSetFuncNormTol(kmem, fnormtol);
    if (check_flag(&flag, "KINSetFuncNormTol", 1)) { return (1); }
    flag = KINSetScaledStepTol(kmem, scsteptol);
    if (check_flag(&flag, "KINSetScaledStepTol", 1)) { return (1); }

    /* Attach a linear solver module */
    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;

    /* (b) SPBCGS */
    case (USE_SPBCGS):

      /* Print header */
      printf(" --------");
      printf(" \n| SPBCGS |\n");
      printf(" --------\n");

      /* Create SUNLinSol_SPBCGS object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPBCGS(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Create SUNLinSol_SPTFQMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 25;
      LS   = SUNLinSol_SPTFQMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPFGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPFGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPFGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;
    }

    /* Set preconditioner functions */
    flag = KINSetPreconditioner(kmem, PrecSetupBD, PrecSolveBD);
    if (check_flag(&flag, "KINSetPreconditioner", 1)) { return (1); }

    /* Print out the problem size, solution parameters, initial guess. */
    PrintHeader(globalstrategy, maxl, maxlrst, fnormtol, scsteptol, linsolver);

    /* Call KINSol and print output concentration profile */
    flag = KINSol(kmem,           /* KINSol memory block */
                  cc,             /* initial guess on input; solution vector */
                  globalstrategy, /* global strategy choice */
                  sc,             /* scaling vector, for the variable cc */
                  sc);            /* scaling vector for function values fval */
    if (check_flag(&flag, "KINSol", 1)) { return (1); }

    printf("\n\nComputed equilibrium species concentrations:\n");
    PrintOutput(cc);

    /* Print final statistics and free memory */
    PrintFinalStats(kmem, linsolver);

    KINFree(&kmem);
    SUNLinSolFree(LS);

  } /* END: Loop through SPGMR, SPBCGS, SPTFQMR, and SPFGMR linear solver modules */

  N_VDestroy(constraints);
  N_VDestroy(cc);
  N_VDestroy(sc);
  FreeUserData(data);

  SUNContext_Free(&sunctx);
  return (0);
}